

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O1

WebPMuxError WebPMuxNumChunks(WebPMux *mux,WebPChunkId id,int *num_elements)

{
  WebPMuxError WVar1;
  int iVar2;
  WebPChunk **ppWVar3;
  uint uVar4;
  WebPChunk *pWVar5;
  WebPChunkId WVar6;
  WebPChunkId *pWVar7;
  
  WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  if (num_elements != (int *)0x0 && mux != (WebPMux *)0x0) {
    if ((id < WEBP_CHUNK_EXIF) && ((0x68U >> (id & 0x1f) & 1) != 0)) {
      iVar2 = MuxImageCount(mux->images_,id);
    }
    else {
      ppWVar3 = MuxGetChunkListFromId(mux,id);
      WVar6 = WEBP_CHUNK_VP8X;
      pWVar7 = &kChunks[1].id;
      uVar4 = 0;
      do {
        if (WVar6 == id) goto LAB_00151211;
        uVar4 = uVar4 + 1;
        WVar6 = *pWVar7;
        pWVar7 = pWVar7 + 3;
      } while (WVar6 != WEBP_CHUNK_NIL);
      uVar4 = 10;
LAB_00151211:
      pWVar5 = *ppWVar3;
      if (pWVar5 == (WebPChunk *)0x0) {
        iVar2 = 0;
      }
      else {
        iVar2 = 0;
        do {
          if ((kChunks[uVar4].tag == 0) || (pWVar5->tag_ == kChunks[uVar4].tag)) {
            iVar2 = iVar2 + 1;
          }
          pWVar5 = pWVar5->next_;
        } while (pWVar5 != (WebPChunk *)0x0);
      }
    }
    *num_elements = iVar2;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxNumChunks(const WebPMux* mux,
                              WebPChunkId id, int* num_elements) {
  if (mux == NULL || num_elements == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  if (IsWPI(id)) {
    *num_elements = MuxImageCount(mux->images_, id);
  } else {
    WebPChunk* const* chunk_list = MuxGetChunkListFromId(mux, id);
    const CHUNK_INDEX idx = ChunkGetIndexFromId(id);
    *num_elements = CountChunks(*chunk_list, kChunks[idx].tag);
  }

  return WEBP_MUX_OK;
}